

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O3

long absl::lts_20250127::debugging_internal::VDSOSupport::GetCPUViaSyscall
               (uint *cpu,void *param_2,void *param_3)

{
  long lVar1;
  
  lVar1 = syscall(0x135,cpu,0,0);
  return lVar1;
}

Assistant:

long VDSOSupport::GetCPUViaSyscall(unsigned *cpu,  // NOLINT(runtime/int)
                                   void *, void *) {
#ifdef SYS_getcpu
  return syscall(SYS_getcpu, cpu, nullptr, nullptr);
#else
  // x86_64 never implemented sys_getcpu(), except as a VDSO call.
  static_cast<void>(cpu);  // Avoid an unused argument compiler warning.
  errno = ENOSYS;
  return -1;
#endif
}